

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.c
# Opt level: O0

float64 determinant(float32 **a,int32 n)

{
  int local_3c;
  int local_38;
  int32 i;
  int32 info;
  char uplo;
  float64 det;
  float32 **tmp_a;
  float32 **ppfStack_18;
  int32 n_local;
  float32 **a_local;
  
  tmp_a._4_4_ = n;
  ppfStack_18 = a;
  det = (float64)__ckd_calloc_2d__((long)n,(long)n,4,
                                   "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libsphinxbase/util/matrix.c"
                                   ,0x9d);
  memcpy(*(void **)det,*ppfStack_18,(long)(tmp_a._4_4_ * tmp_a._4_4_) << 2);
  i._3_1_ = 0x4c;
  spotrf_((char *)((long)&i + 3),(integer *)((long)&tmp_a + 4),*(real **)det,
          (integer *)((long)&tmp_a + 4),&local_38);
  _info = (double)**(float **)det;
  for (local_3c = 1; local_3c < tmp_a._4_4_; local_3c = local_3c + 1) {
    _info = (double)*(float *)(*(long *)((long)det + (long)local_3c * 8) + (long)local_3c * 4) *
            _info;
  }
  ckd_free_2d((void *)det);
  if (local_38 < 1) {
    a_local = (float32 **)(_info * _info);
  }
  else {
    a_local = (float32 **)0xbff0000000000000;
  }
  return (float64)a_local;
}

Assistant:

float64
determinant(float32 ** a, int32 n)
{
    float32 **tmp_a;
    float64 det;
    char uplo;
    int32 info, i;

    /* a is assumed to be symmetric, so we don't need to switch the
     * ordering of the data.  But we do need to copy it since it is
     * overwritten by LAPACK. */
    tmp_a = (float32 **)ckd_calloc_2d(n, n, sizeof(float32));
    memcpy(tmp_a[0], a[0], n*n*sizeof(float32));

    uplo = 'L';
    spotrf_(&uplo, &n, tmp_a[0], &n, &info);
    det = tmp_a[0][0];
    /* det = prod(diag(l))^2 */
    for (i = 1; i < n; ++i)
	det *= tmp_a[i][i];
    ckd_free_2d((void **)tmp_a);
    if (info > 0)
	return -1.0; /* Generic "not positive-definite" answer */
    else
	return det * det;
}